

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_outputParameterTraced_Test::testBody
          (TEST_MockParameterTest_outputParameterTraced_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  char *pcVar4;
  SimpleString SStack_48;
  int param;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x23])(pMVar2,1);
  SimpleString::~SimpleString(&SStack_48);
  param = 1;
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_20,"someFunc");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_20);
  SimpleString::SimpleString(&local_30,"someParameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_30,&param);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_48);
  pUVar3 = UtestShell::getCurrent();
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  pcVar4 = MockSupport::getTraceOutput(pMVar2);
  (*pUVar3->_vptr_UtestShell[0xc])
            (pUVar3,"Function name:someFunc someParameter:",pcVar4,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x343);
  SimpleString::~SimpleString(&SStack_48);
  SimpleString::SimpleString(&SStack_48,"");
  pMVar2 = mock(&SStack_48,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_48);
  return;
}

Assistant:

TEST(MockParameterTest, outputParameterTraced)
{
    mock().tracing(true);

    int param = 1;
    mock().actualCall("someFunc").withOutputParameter("someParameter", &param);
    mock().checkExpectations();
    STRCMP_CONTAINS("Function name:someFunc someParameter:", mock().getTraceOutput());

    mock().checkExpectations();
}